

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPubkey * __thiscall
cfd::core::ExtPrivkey::DerivePubkey
          (ExtPubkey *__return_storage_ptr__,ExtPrivkey *this,string *string_path)

{
  ExtPrivkey *this_00;
  undefined1 local_98 [8];
  ExtPrivkey privkey;
  string *string_path_local;
  ExtPrivkey *this_local;
  
  this_00 = (ExtPrivkey *)__return_storage_ptr__;
  privkey.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)string_path;
  DerivePrivkey((ExtPrivkey *)local_98,this,string_path);
  GetExtPubkey(__return_storage_ptr__,(ExtPrivkey *)local_98);
  ~ExtPrivkey(this_00);
  return (ExtPubkey *)this_00;
}

Assistant:

ExtPubkey ExtPrivkey::DerivePubkey(const std::string& string_path) const {
  ExtPrivkey privkey = DerivePrivkey(string_path);
  return privkey.GetExtPubkey();
}